

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_conductor.hpp
# Opt level: O3

Color __thiscall
RoughConductorBRDF::sample_f
          (RoughConductorBRDF *this,Color *albedo,vec3f *wo,vec3f *wi,float *pdf,Sampler *sampler)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  undefined8 extraout_XMM0_Qa;
  float fVar6;
  undefined8 uVar5;
  undefined8 extraout_XMM0_Qa_00;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  vec3f vVar18;
  Color CVar19;
  
  (*sampler->_vptr_Sampler[1])();
  vVar18 = schuttejoe::GgxVndf((schuttejoe *)sampler,*wo,this->alpha,(float)extraout_XMM0_Qa,
                               (float)((ulong)extraout_XMM0_Qa >> 0x20));
  fVar7 = vVar18.z;
  fVar3 = vVar18.x;
  fVar6 = vVar18.y;
  uVar1 = wo->x;
  uVar2 = wo->y;
  fVar12 = fVar7 * wo->z + fVar3 * (float)uVar1 + fVar6 * (float)uVar2;
  fVar12 = fVar12 + fVar12;
  fVar13 = fVar12 * fVar3 - (float)uVar1;
  fVar14 = fVar12 * fVar6 - (float)uVar2;
  fVar8 = fVar7 * fVar12 - wo->z;
  wi->x = fVar13;
  wi->y = fVar14;
  wi->z = fVar8;
  fVar12 = -fVar7;
  fVar16 = fVar3;
  fVar17 = fVar6;
  if (fVar7 < fVar12) {
    fVar16 = -fVar3;
    fVar17 = -fVar6;
  }
  fVar4 = 1.0 - fVar8 * fVar8;
  fVar11 = 1.0;
  if (0.0 < fVar4) {
    fVar15 = this->alpha;
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    fVar4 = fVar4 / fVar8;
    fVar11 = 1.0;
    if ((fVar4 != 0.0) || (NAN(fVar4))) {
      if (fVar12 <= fVar7) {
        fVar12 = fVar7;
      }
      fVar11 = 0.0;
      if (0.0 < (fVar12 * fVar8 + fVar13 * fVar16 + fVar14 * fVar17) * fVar8) {
        fVar15 = fVar15 * ABS(fVar4);
        fVar11 = 2.0 / (SQRT(fVar15 * fVar15 + 1.0) + 1.0);
      }
    }
  }
  fVar12 = this->alpha;
  fVar16 = fVar7 * fVar7;
  auVar9._4_4_ = fVar12;
  auVar9._0_4_ = 0x3f800000;
  auVar9._8_8_ = 0;
  auVar10._4_4_ =
       (fVar12 * fVar12 + (float)(-(uint)(0.0 < 1.0 - fVar16) & (uint)((1.0 - fVar16) / fVar16))) *
       fVar16;
  auVar10._0_4_ = PI;
  auVar10._8_8_ = 0;
  auVar10 = divps(auVar9,auVar10);
  *pdf = (ABS(fVar7 * wo->z + wo->x * fVar3 + wo->y * fVar6) *
         auVar10._4_4_ * auVar10._4_4_ * auVar10._0_4_ * fVar11) /
         (ABS(wo->z) * ABS(wi->z * fVar7 + wi->x * fVar3 + fVar6 * wi->y) * 4.0);
  fVar16 = (float)-(uint)(wi->z < 0.0 != wo->z < 0.0);
  uVar5 = 0;
  fVar12 = 0.0;
  if (((uint)fVar16 & 1) == 0) {
    (*(this->super_BRDF)._vptr_BRDF[1])(this,albedo,wo,wi);
    uVar5 = extraout_XMM0_Qa_00;
    fVar12 = fVar16;
  }
  CVar19.z = fVar12;
  CVar19.x = (float)(int)uVar5;
  CVar19.y = (float)(int)((ulong)uVar5 >> 0x20);
  return CVar19;
}

Assistant:

Color sample_f(const Color& albedo, const vec3f& wo, vec3f& wi, float& pdf, Sampler& sampler) const override
	{
		vec2f u = sampler.get2f();
    	vec3f wm = schuttejoe::GgxVndf(wo, alpha, u.x, u.y);
		wi = 2*dot(wm,wo)*wm-wo;
		// http://jcgt.org/published/0007/04/01/paper.pdf Eric Heitz
		pdf = EDX::Smith_G1(wi, wm, alpha) * EDX::GGX_D(wm,alpha) * fabs(dot(wo,wm)) / (4 * fabs(dot(wi, wm)) * fabs(wo.z));
    	if (wi.z<0 ^ wo.z<0) return 0;
    	return f(albedo, wo, wi);
	}